

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3Realloc(void *pOld,u64 nBytes)

{
  sqlite3StatValueType sVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  uint uVar5;
  sqlite3StatValueType newValue;
  
  if (pOld == (void *)0x0) {
    pvVar4 = sqlite3Malloc(nBytes);
    return pvVar4;
  }
  if (nBytes == 0) {
    sqlite3_free(pOld);
  }
  else if (nBytes < 0x7fffff00) {
    iVar2 = (*sqlite3Config.m.xSize)(pOld);
    iVar3 = (*sqlite3Config.m.xRoundup)((int)nBytes);
    if (iVar3 == iVar2) {
      return pOld;
    }
    if (sqlite3Config.bMemstat != 0) {
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
      }
      sVar1 = sqlite3Stat.nowValue[0];
      if (sqlite3Stat.mxValue[5] < (long)nBytes) {
        sqlite3Stat.mxValue[5] = nBytes;
      }
      uVar5 = iVar3 - iVar2;
      if ((uVar5 != 0 && iVar2 <= iVar3) &&
         ((long)(mem0.alarmThreshold - (ulong)uVar5) <= sqlite3Stat.nowValue[0])) {
        if (0 < mem0.alarmThreshold) {
          if (mem0.mutex != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
          }
          if (mem0.mutex != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
          }
        }
        if ((0 < mem0.hardLimit) && ((long)(mem0.hardLimit - (ulong)uVar5) <= sVar1)) {
          if (mem0.mutex == (sqlite3_mutex *)0x0) {
            return (void *)0x0;
          }
          (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
          return (void *)0x0;
        }
      }
      pvVar4 = (*sqlite3Config.m.xRealloc)(pOld,iVar3);
      if (pvVar4 != (void *)0x0) {
        iVar3 = (*sqlite3Config.m.xSize)(pvVar4);
        sqlite3Stat.nowValue[0] = (iVar3 - iVar2) + sqlite3Stat.nowValue[0];
        if (sqlite3Stat.mxValue[0] < sqlite3Stat.nowValue[0]) {
          sqlite3Stat.mxValue[0] = sqlite3Stat.nowValue[0];
        }
      }
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
        return pvVar4;
      }
      return pvVar4;
    }
    pvVar4 = (*sqlite3Config.m.xRealloc)(pOld,iVar3);
    return pvVar4;
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Realloc(void *pOld, u64 nBytes){
  int nOld, nNew, nDiff;
  void *pNew;
  assert( sqlite3MemdebugHasType(pOld, MEMTYPE_HEAP) );
  assert( sqlite3MemdebugNoType(pOld, (u8)~MEMTYPE_HEAP) );
  if( pOld==0 ){
    return sqlite3Malloc(nBytes); /* IMP: R-04300-56712 */
  }
  if( nBytes==0 ){
    sqlite3_free(pOld); /* IMP: R-26507-47431 */
    return 0;
  }
  if( nBytes>=0x7fffff00 ){
    /* The 0x7ffff00 limit term is explained in comments on sqlite3Malloc() */
    return 0;
  }
  nOld = sqlite3MallocSize(pOld);
  /* IMPLEMENTATION-OF: R-46199-30249 SQLite guarantees that the second
  ** argument to xRealloc is always a value returned by a prior call to
  ** xRoundup. */
  nNew = sqlite3GlobalConfig.m.xRoundup((int)nBytes);
  if( nOld==nNew ){
    pNew = pOld;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_int64 nUsed;
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusHighwater(SQLITE_STATUS_MALLOC_SIZE, (int)nBytes);
    nDiff = nNew - nOld;
    if( nDiff>0 && (nUsed = sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED)) >=
          mem0.alarmThreshold-nDiff ){
      sqlite3MallocAlarm(nDiff);
      if( mem0.hardLimit>0 && nUsed >= mem0.hardLimit - nDiff ){
        sqlite3_mutex_leave(mem0.mutex);
        return 0;
      }
    }
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
#ifdef SQLITE_ENABLE_MEMORY_MANAGEMENT
    if( pNew==0 && mem0.alarmThreshold>0 ){
      sqlite3MallocAlarm((int)nBytes);
      pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    }
#endif
    if( pNew ){
      nNew = sqlite3MallocSize(pNew);
      sqlite3StatusUp(SQLITE_STATUS_MEMORY_USED, nNew-nOld);
    }
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
  }
  assert( EIGHT_BYTE_ALIGNMENT(pNew) ); /* IMP: R-11148-40995 */
  return pNew;
}